

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

long lsh::vector::random(void)

{
  uint uVar1;
  result_type rVar2;
  ulong *puVar3;
  ulong uVar4;
  uint in_ESI;
  vector *in_RDI;
  uint i;
  size_type __n;
  reference rVar5;
  uniform_int_distribution<int> components;
  vector<bool,_std::allocator<bool>_> c;
  random_device random;
  mt19937 generator;
  allocator_type local_2779;
  vector *local_2778;
  param_type local_2770;
  _Bvector_base<std::allocator<bool>_> local_2768;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_2778 = in_RDI;
  std::random_device::random_device(&local_2740);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar1);
  local_2770._M_a = 0;
  local_2770._M_b = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_2768,(ulong)in_ESI,&local_2779);
  for (__n = 0; in_ESI != __n; __n = __n + 1) {
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_2770,&local_13b8);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_2768,__n);
    puVar3 = rVar5._M_p;
    if (rVar2 == 0) {
      uVar4 = ~rVar5._M_mask & *puVar3;
    }
    else {
      uVar4 = rVar5._M_mask | *puVar3;
    }
    *puVar3 = uVar4;
  }
  vector(local_2778,(vector<bool,_std::allocator<bool>_> *)&local_2768);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_2768);
  std::random_device::~random_device(&local_2740);
  return (long)local_2778;
}

Assistant:

vector vector::random(unsigned int d) {
    std::random_device random;
    std::mt19937 generator(random());
    std::uniform_int_distribution<> components(0, 1);

    std::vector<bool> c(d);

    for (unsigned int i = 0; i < d; i++) {
      c[i] = components(generator);
    }

    return vector(c);
  }